

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall
t_java_generator::generate_deserialize_field
          (t_java_generator *this,ostream *out,t_field *tfield,string *prefix,bool has_metadata)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  t_struct *tstruct;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  string *this_00;
  undefined1 auVar7 [12];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tstruct = (t_struct *)t_type::get_true_type(tfield->type_);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[4])(tstruct);
  if ((char)iVar3 != '\0') {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(&name,"CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: ",prefix);
    std::operator+(pbVar5,&name,&tfield->name_);
    __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator+(&name,prefix,&tfield->name_);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if (((char)iVar3 == '\0') &&
     (iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xc])(tstruct), (char)iVar3 == '\0')
     ) {
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xd])(tstruct);
    if ((char)iVar3 == '\0') {
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[5])(tstruct);
      if ((char)iVar3 != '\0') {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,(string *)&name);
        std::operator<<(poVar4," = iprot.");
        uVar1 = *(uint *)&(tstruct->members_).
                          super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
        switch(uVar1) {
        case 0:
          pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::operator+(pbVar5,"compiler error: cannot serialize void field in a struct: ",&name);
          __cxa_throw(pbVar5,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        case 1:
          iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[7])(tstruct);
          pcVar6 = "readString();";
          if ((char)iVar3 != '\0') {
            pcVar6 = "readBinary();";
          }
          break;
        case 2:
          pcVar6 = "readBool();";
          break;
        case 3:
          pcVar6 = "readByte();";
          break;
        case 4:
          pcVar6 = "readI16();";
          break;
        case 5:
          pcVar6 = "readI32();";
          break;
        case 6:
          pcVar6 = "readI64();";
          break;
        case 7:
          pcVar6 = "readDouble();";
          break;
        default:
          auVar7 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_b0,(t_base_type *)(ulong)uVar1,auVar7._8_4_);
          std::operator+(auVar7._0_8_,"compiler error: no Java name for base type ",&local_b0);
          __cxa_throw(auVar7._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        std::operator<<(out,pcVar6);
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
        goto LAB_001fd703;
      }
      iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[10])(tstruct);
      if ((char)iVar3 == '\0') {
        pcVar2 = (tfield->name_)._M_dataplus._M_p;
        type_name_abi_cxx11_(&local_b0,this,(t_type *)tstruct,false,false,false,false);
        this_00 = &local_b0;
        printf("DO NOT KNOW HOW TO DESERIALIZE FIELD \'%s\' TYPE \'%s\'\n",pcVar2,
               local_b0._M_dataplus._M_p);
      }
      else {
        poVar4 = t_generator::indent((t_generator *)this,out);
        poVar4 = std::operator<<(poVar4,(string *)&name);
        poVar4 = std::operator<<(poVar4," = ");
        type_name_abi_cxx11_(&local_90,this,tfield->type_,true,false,false,true);
        std::operator+(&local_b0,&local_90,".findByValue(iprot.readI32());");
        poVar4 = std::operator<<(poVar4,(string *)&local_b0);
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_b0);
        this_00 = &local_90;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_70,(string *)&name);
      generate_deserialize_container(this,out,(t_type *)tstruct,&local_70,has_metadata);
      this_00 = &local_70;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)&name);
    generate_deserialize_struct(this,out,tstruct,&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001fd703:
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

void t_java_generator::generate_deserialize_field(ostream& out,
                                                  t_field* tfield,
                                                  string prefix,
                                                  bool has_metadata) {
  t_type* type = get_true_type(tfield->get_type());

  if (type->is_void()) {
    throw "CANNOT GENERATE DESERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name();
  }

  string name = prefix + tfield->get_name();

  if (type->is_struct() || type->is_xception()) {
    generate_deserialize_struct(out, (t_struct*)type, name);
  } else if (type->is_container()) {
    generate_deserialize_container(out, type, name, has_metadata);
  } else if (type->is_base_type()) {
    indent(out) << name << " = iprot.";

    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot serialize void field in a struct: " + name;
      break;
    case t_base_type::TYPE_STRING:
      if (type->is_binary()) {
        out << "readBinary();";
      } else {
        out << "readString();";
      }
      break;
    case t_base_type::TYPE_BOOL:
      out << "readBool();";
      break;
    case t_base_type::TYPE_I8:
      out << "readByte();";
      break;
    case t_base_type::TYPE_I16:
      out << "readI16();";
      break;
    case t_base_type::TYPE_I32:
      out << "readI32();";
      break;
    case t_base_type::TYPE_I64:
      out << "readI64();";
      break;
    case t_base_type::TYPE_DOUBLE:
      out << "readDouble();";
      break;
    default:
      throw "compiler error: no Java name for base type " + t_base_type::t_base_name(tbase);
    }
    out << endl;
  } else if (type->is_enum()) {
    indent(out) << name << " = "
                << type_name(tfield->get_type(), true, false, false, true)
                   + ".findByValue(iprot.readI32());" << endl;
  } else {
    printf("DO NOT KNOW HOW TO DESERIALIZE FIELD '%s' TYPE '%s'\n",
           tfield->get_name().c_str(),
           type_name(type).c_str());
  }
}